

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

shared_ptr<duckdb::RowVersionManager,_true> __thiscall
duckdb::RowGroup::GetOrCreateVersionInfoInternal(RowGroup *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RowGroup *in_RSI;
  shared_ptr<duckdb::RowVersionManager,_true> sVar1;
  shared_ptr<duckdb::RowVersionManager,_true> new_info;
  shared_ptr<duckdb::RowVersionManager,_true> local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  ::std::mutex::lock(&in_RSI->row_group_lock);
  if ((in_RSI->owned_version_info).internal.
      super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    make_shared_ptr<duckdb::RowVersionManager,unsigned_long&>((unsigned_long *)&local_38);
    local_48.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_38;
    local_48.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_30._M_pi;
    local_38 = (element_type *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    SetVersionInfo(in_RSI,&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.internal.
                super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  }
  ::std::__shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2> *)
             &in_RSI->owned_version_info);
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->row_group_lock);
  sVar1.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::RowVersionManager,_true>)
         sVar1.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowVersionManager> RowGroup::GetOrCreateVersionInfoInternal() {
	// version info does not exist - need to create it
	lock_guard<mutex> lock(row_group_lock);
	if (!owned_version_info) {
		auto new_info = make_shared_ptr<RowVersionManager>(start);
		SetVersionInfo(std::move(new_info));
	}
	return owned_version_info;
}